

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O1

void ComputeEmitterChannelCoefficients
               (ConfigInfo *curConfig,F3DAUDIO_BASIS *listenerBasis,float innerRadius,
               F3DAUDIO_VECTOR channelPosition,float attenuation,float LFEattenuation,uint32_t flags
               ,uint32_t currentChannel,uint32_t numSrcChannels,float *pMatrixCoefficients)

{
  long lVar1;
  float fVar2;
  uint32_t uVar3;
  SpeakerInfo *pSVar4;
  bool bVar5;
  long lVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  
  uVar13 = flags >> 0x10;
  fVar14 = (listenerBasis->top).x;
  fVar16 = (listenerBasis->top).y;
  fVar18 = (listenerBasis->top).z;
  fVar20 = fVar18 * channelPosition.z + fVar14 * channelPosition.x + channelPosition.y * fVar16;
  fVar15 = channelPosition.x - fVar14 * fVar20;
  fVar21 = channelPosition.y - fVar16 * fVar20;
  fVar16 = channelPosition.z - fVar20 * fVar18;
  fVar14 = (float)SDL_sqrtf(fVar16 * fVar16 + fVar15 * fVar15 + fVar21 * fVar21);
  if (fVar14 <= 1e-07) {
    fVar20 = 1.0;
    fVar18 = 0.0;
    fVar14 = 0.0;
  }
  else {
    if (innerRadius <= 4e-07) {
      innerRadius = 4e-07;
    }
    fVar14 = fVar14 / innerRadius;
    if (fVar14 <= 0.5) {
      fVar20 = 1.0 - (fVar14 + fVar14);
      fVar18 = fVar20 * 0.0 + (fVar14 + fVar14) * 0.707107;
      fVar14 = 1.0 - fVar20;
    }
    else {
      fVar18 = 1.0;
      fVar20 = 0.0;
      if (1.0 < fVar14) {
        fVar14 = 0.0;
        goto LAB_00109b17;
      }
      fVar18 = fVar14 + -0.5 + fVar14 + -0.5;
      fVar14 = 1.0;
      fVar18 = (1.0 - fVar18) * 0.707107 + fVar18;
    }
    fVar14 = fVar14 - fVar18;
  }
LAB_00109b17:
  if (0.0 < fVar20) {
    uVar9 = curConfig->numNonLFSpeakers;
    uVar7 = 0xffffffff;
    uVar10 = uVar9;
    if ((uVar13 & 1) != 0) {
      uVar10 = uVar9 - 1;
      uVar7 = curConfig->speakers->matrixIdx;
    }
    if (uVar9 != 0) {
      pSVar4 = curConfig->speakers;
      uVar11 = 0;
      do {
        uVar3 = pSVar4[uVar11].matrixIdx;
        if (((flags >> 0x10 & 1) == 0) || (uVar3 != uVar7)) {
          uVar12 = uVar3 * numSrcChannels + currentChannel;
          pMatrixCoefficients[uVar12] =
               pMatrixCoefficients[uVar12] + (fVar20 * attenuation) / (float)uVar10;
        }
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
  }
  if (0.0 < fVar18) {
    fVar20 = (float)SDL_atan2f((listenerBasis->right).z * fVar16 +
                               (listenerBasis->right).x * fVar15 + (listenerBasis->right).y * fVar21
                               ,(listenerBasis->front).z * fVar16 +
                                (listenerBasis->front).x * fVar15 +
                                (listenerBasis->front).y * fVar21);
    fVar20 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar20 |
                    (uint)(fVar20 + 6.2831855) & -(uint)(fVar20 < 0.0));
    uVar9 = curConfig->numNonLFSpeakers;
    if ((ulong)uVar9 == 0) {
      uVar10 = 0;
      bVar19 = true;
      uVar11 = 0;
      bVar5 = true;
    }
    else {
      lVar1 = (ulong)uVar9 - 1;
      lVar6 = 0;
      while( true ) {
        uVar11 = (ulong)((uint)lVar6 + 1);
        if (lVar1 == lVar6) {
          uVar11 = 0;
        }
        fVar17 = curConfig->speakers[lVar6].azimuth;
        fVar2 = curConfig->speakers[uVar11].azimuth;
        if (fVar2 <= fVar17) {
          bVar19 = fVar17 <= fVar20 || fVar20 < fVar2;
        }
        else {
          bVar19 = fVar17 <= fVar20 && fVar20 < fVar2;
        }
        if ((lVar1 == lVar6) || (bVar19)) break;
        lVar6 = lVar6 + 1;
      }
      uVar10 = (uint)lVar6;
      if (!bVar19) {
        uVar10 = uVar9;
      }
      bVar19 = fVar17 == 0.0;
      bVar5 = fVar2 == 0.0;
    }
    if ((uVar13 & 1) != 0) {
      if (bVar19) {
        if (uVar10 == 0) {
          uVar10 = uVar9 - 1;
        }
        else {
          uVar10 = uVar10 - 1;
        }
      }
      else if (bVar5) {
        uVar8 = (int)uVar11 + 1;
        uVar12 = 0;
        if (uVar9 <= uVar8) {
          uVar12 = uVar9;
        }
        uVar11 = (ulong)(uVar8 - uVar12);
      }
    }
    pSVar4 = curConfig->speakers;
    fVar17 = pSVar4[uVar10].azimuth;
    if (pSVar4[uVar11].azimuth < fVar17) {
      fVar20 = (float)(-(uint)(fVar20 < fVar17) & (uint)fVar20 |
                      ~-(uint)(fVar20 < fVar17) & (uint)(fVar20 + -6.2831855));
      fVar17 = fVar17 + -6.2831855;
    }
    fVar20 = (fVar20 - fVar17) / (pSVar4[uVar11].azimuth - fVar17);
    uVar9 = pSVar4[uVar10].matrixIdx * numSrcChannels + currentChannel;
    uVar7 = pSVar4[uVar11].matrixIdx;
    pMatrixCoefficients[uVar9] = (1.0 - fVar20) * fVar18 * attenuation + pMatrixCoefficients[uVar9];
    uVar9 = uVar7 * numSrcChannels + currentChannel;
    pMatrixCoefficients[uVar9] = fVar20 * fVar18 * attenuation + pMatrixCoefficients[uVar9];
  }
  if (0.0 < fVar14) {
    fVar16 = (float)SDL_atan2f(fVar16 * (listenerBasis->right).z +
                               fVar15 * (listenerBasis->right).x + fVar21 * (listenerBasis->right).y
                               ,(listenerBasis->front).z * fVar16 +
                                (listenerBasis->front).x * fVar15 +
                                (listenerBasis->front).y * fVar21);
    fVar16 = fVar16 + 3.1415927;
    if (0.0 <= fVar16) {
      if (6.2831855 < fVar16) {
        fVar16 = fVar16 + -6.2831855;
      }
    }
    else {
      fVar16 = fVar16 + 6.2831855;
    }
    uVar9 = curConfig->numNonLFSpeakers;
    if ((ulong)uVar9 == 0) {
      uVar10 = 0;
      bVar19 = true;
      uVar11 = 0;
      bVar5 = true;
    }
    else {
      lVar1 = (ulong)uVar9 - 1;
      lVar6 = 0;
      while( true ) {
        uVar11 = (ulong)((uint)lVar6 + 1);
        if (lVar1 == lVar6) {
          uVar11 = 0;
        }
        fVar18 = curConfig->speakers[lVar6].azimuth;
        fVar15 = curConfig->speakers[uVar11].azimuth;
        if (fVar15 <= fVar18) {
          bVar19 = fVar18 <= fVar16 || fVar16 < fVar15;
        }
        else {
          bVar19 = fVar18 <= fVar16 && fVar16 < fVar15;
        }
        if ((lVar1 == lVar6) || (bVar19)) break;
        lVar6 = lVar6 + 1;
      }
      uVar10 = (uint)lVar6;
      if (!bVar19) {
        uVar10 = uVar9;
      }
      bVar19 = fVar18 == 0.0;
      bVar5 = fVar15 == 0.0;
    }
    if ((uVar13 & 1) != 0) {
      if (bVar19) {
        if (uVar10 == 0) {
          uVar10 = uVar9 - 1;
        }
        else {
          uVar10 = uVar10 - 1;
        }
      }
      else if (bVar5) {
        uVar12 = (int)uVar11 + 1;
        uVar13 = 0;
        if (uVar9 <= uVar12) {
          uVar13 = uVar9;
        }
        uVar11 = (ulong)(uVar12 - uVar13);
      }
    }
    pSVar4 = curConfig->speakers;
    fVar18 = pSVar4[uVar10].azimuth;
    if (pSVar4[uVar11].azimuth < fVar18) {
      fVar16 = (float)(-(uint)(fVar16 < fVar18) & (uint)fVar16 |
                      ~-(uint)(fVar16 < fVar18) & (uint)(fVar16 + -6.2831855));
      fVar18 = fVar18 + -6.2831855;
    }
    fVar16 = (fVar16 - fVar18) / (pSVar4[uVar11].azimuth - fVar18);
    uVar13 = pSVar4[uVar10].matrixIdx * numSrcChannels + currentChannel;
    uVar7 = pSVar4[uVar11].matrixIdx;
    pMatrixCoefficients[uVar13] =
         (1.0 - fVar16) * fVar14 * attenuation + pMatrixCoefficients[uVar13];
    uVar13 = uVar7 * numSrcChannels + currentChannel;
    pMatrixCoefficients[uVar13] = fVar16 * fVar14 * attenuation + pMatrixCoefficients[uVar13];
  }
  if ((flags >> 0x11 & 1) != 0) {
    uVar13 = numSrcChannels * curConfig->LFSpeakerIdx + currentChannel;
    pMatrixCoefficients[uVar13] =
         LFEattenuation / (float)numSrcChannels + pMatrixCoefficients[uVar13];
  }
  return;
}

Assistant:

static inline void ComputeEmitterChannelCoefficients(
	const ConfigInfo *curConfig,
	const F3DAUDIO_BASIS *listenerBasis,
	float innerRadius,
	F3DAUDIO_VECTOR channelPosition,
	float attenuation,
	float LFEattenuation,
	uint32_t flags,
	uint32_t currentChannel,
	uint32_t numSrcChannels,
	float *pMatrixCoefficients
) {
	float elevation, radialDistance;
	F3DAUDIO_VECTOR projTopVec, projPlane;
	uint8_t skipCenter = (flags & F3DAUDIO_CALCULATE_ZEROCENTER) ? 1 : 0;
	DiffusionSpeakerFactors diffusionFactors = { 0.0f };

	float x, y;
	float emitterAzimuth;
	float energyPerChannel;
	float totalEnergy;
	uint32_t nChannelsToDiffuseTo;
	uint32_t iS, centerChannelIdx = -1;
	const SpeakerInfo* infos[2];
	float a0, a1, val;
	uint32_t i0, i1;

	/* We project against the listener basis' top vector to get the elevation of the
	 * current emitter channel position.
	 */
	elevation = VectorDot(listenerBasis->top, channelPosition);

	/* To obtain the projection in the front-right plane of the listener's basis of the
	 * emitter channel position, we simply remove the projection against the top vector.
	 * The radial distance is then the length of the projected vector.
	 */
	projTopVec = VectorScale(listenerBasis->top, elevation);
	projPlane = VectorSub(channelPosition, projTopVec);
	radialDistance = VectorLength(projPlane);

	ComputeInnerRadiusDiffusionFactors(
		radialDistance,
		innerRadius,
		diffusionFactors
	);

	/* See the ComputeInnerRadiusDiffusionFactors comment above for more context. */
	/* DIFFUSION_SPEAKERS_ALL corresponds to diffusing part of the sound to all of the
	 * speakers, equally. The amount of sound is determined by the float value
	 * diffusionFactors[DIFFUSION_SPEAKERS_ALL]. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_ALL] > 0.0f)
	{
		nChannelsToDiffuseTo = curConfig->numNonLFSpeakers;
		totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_ALL] * attenuation;

		if (skipCenter)
		{
			nChannelsToDiffuseTo -= 1;
			FAudio_assert(curConfig->speakers[0].azimuth == SPEAKER_AZIMUTH_CENTER);
			centerChannelIdx = curConfig->speakers[0].matrixIdx;
		}

		energyPerChannel = totalEnergy / nChannelsToDiffuseTo;

		for (iS = 0; iS < curConfig->numNonLFSpeakers; iS += 1)
		{
			const uint32_t curSpeakerIdx = curConfig->speakers[iS].matrixIdx;
			if (skipCenter && curSpeakerIdx == centerChannelIdx)
			{
				continue;
			}

			pMatrixCoefficients[curSpeakerIdx * numSrcChannels + currentChannel] += energyPerChannel;
		}
	}

	/* DIFFUSION_SPEAKERS_MATCHING corresponds to sending part of the sound to the speakers closest
	 * (in terms of azimuth) to the current position of the emitter. The amount of sound we shoud send
	 * corresponds here to diffusionFactors[DIFFUSION_SPEAKERS_MATCHING].
	 * We use the FindSpeakerAzimuths function to find the speakers that match. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] > 0.0f)
	{
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Now, a critical point: We shouldn't be sending sound to
		 * matching speakers when x and y are close to 0. That's the
		 * contract we get from ComputeInnerRadiusDiffusionFactors,
		 * which checks that we're not too close to the zero distance.
		 * This allows the atan2 calculation to give good results.
		 */

		/* atan2 returns [-PI, PI], but we want [0, 2PI] */
		emitterAzimuth = FAudio_atan2f(y, x);
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	/* DIFFUSION_SPEAKERS_OPPOSITE corresponds to sending part of the sound to the speakers
	 * _opposite_ the ones that are the closest to the current emitter position.
	 * To find these, we simply find the ones that are closest to the current emitter's azimuth + PI
	 * using the FindSpeakerAzimuth function. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] > 0.0f)
	{
		/* This code is similar to the matching speakers code above. */
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Similarly, we expect atan2 to be well behaved here. */
		emitterAzimuth = FAudio_atan2f(y, x);

		/* Opposite speakers lie at azimuth + PI */
		emitterAzimuth += F3DAUDIO_PI;

		/* Normalize to [0; 2PI) range. */
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}
		else if (emitterAzimuth > F3DAUDIO_2PI)
		{
			emitterAzimuth -= F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	if (flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE)
	{
		FAudio_assert(curConfig->LFSpeakerIdx != -1);
		pMatrixCoefficients[curConfig->LFSpeakerIdx * numSrcChannels + currentChannel] += LFEattenuation / numSrcChannels;
	}
}